

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

lua_Number lua_tonumberx(lua_State *L,int idx,int *pisnum)

{
  int iVar1;
  TValue *obj;
  lua_Number n;
  lua_Number local_10;
  
  obj = index2addr(L,idx);
  if (obj->tt_ == 3) {
    local_10 = (obj->value_).n;
    iVar1 = 1;
  }
  else {
    iVar1 = luaV_tonumber_(obj,&local_10);
  }
  if (iVar1 == 0) {
    local_10 = 0.0;
  }
  if (pisnum != (int *)0x0) {
    *pisnum = iVar1;
  }
  return local_10;
}

Assistant:

LUA_API lua_Number lua_tonumberx (lua_State *L, int idx, int *pisnum) {
  lua_Number n;
  const TValue *o = index2addr(L, idx);
  int isnum = tonumber(o, &n);
  if (!isnum)
    n = 0;  /* call to 'tonumber' may change 'n' even if it fails */
  if (pisnum) *pisnum = isnum;
  return n;
}